

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

int Ga2_ManBreakTree_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fFirst,int N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 1;
  if (fFirst != 0 || -1 < (long)*(ulong *)pObj) {
    iVar1 = Ga2_ManBreakTree_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),0,N);
    iVar2 = Ga2_ManBreakTree_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),0,N);
    iVar3 = iVar2 + iVar1;
    if (N <= iVar3) {
      if (iVar3 != N) {
        if (iVar3 <= N) {
          __assert_fail("Val0 + Val1 > N",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0xbe,"int Ga2_ManBreakTree_rec(Gia_Man_t *, Gia_Obj_t *, int, int)");
        }
        if ((N <= iVar1) || (N <= iVar2)) {
          __assert_fail("Val0 < N && Val1 < N",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0xbf,"int Ga2_ManBreakTree_rec(Gia_Man_t *, Gia_Obj_t *, int, int)");
        }
        uVar4 = *(ulong *)pObj >> 0x20;
        if (iVar2 <= iVar1) {
          uVar4 = *(ulong *)pObj;
        }
        iVar3 = 1;
        if (iVar1 < iVar2) {
          iVar2 = iVar3;
          iVar3 = iVar1;
        }
        *(ulong *)(pObj + -(ulong)((uint)uVar4 & 0x1fffffff)) =
             *(ulong *)(pObj + -(ulong)((uint)uVar4 & 0x1fffffff)) | 0x8000000000000000;
        iVar2 = iVar2 + iVar3;
        if (iVar2 < N) {
          return iVar2;
        }
        if (iVar2 != N) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGla.c"
                        ,0xd1,"int Ga2_ManBreakTree_rec(Gia_Man_t *, Gia_Obj_t *, int, int)");
        }
      }
      *(ulong *)pObj = *(ulong *)pObj | 0x8000000000000000;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int Ga2_ManBreakTree_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fFirst, int N )
{   // breaks a tree rooted at the node into N-feasible subtrees
    int Val0, Val1;
    if ( pObj->fPhase && !fFirst )
        return 1;
    Val0 = Ga2_ManBreakTree_rec( p, Gia_ObjFanin0(pObj), 0, N );
    Val1 = Ga2_ManBreakTree_rec( p, Gia_ObjFanin1(pObj), 0, N );
    if ( Val0 + Val1 < N )
        return Val0 + Val1;
    if ( Val0 + Val1 == N )
    {
        pObj->fPhase = 1;
        return 1;
    }
    assert( Val0 + Val1 > N );
    assert( Val0 < N && Val1 < N );
    if ( Val0 >= Val1 )
    {
        Gia_ObjFanin0(pObj)->fPhase = 1;
        Val0 = 1;
    }
    else 
    {
        Gia_ObjFanin1(pObj)->fPhase = 1;
        Val1 = 1;
    }
    if ( Val0 + Val1 < N )
        return Val0 + Val1;
    if ( Val0 + Val1 == N )
    {
        pObj->fPhase = 1;
        return 1;
    }
    assert( 0 );
    return -1;
}